

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

void EthBasePort::PrintDebugDataRTL(ostream *debugStream,quadlet_t *data,char *portName)

{
  size_t sVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(debugStream,"*** ",4);
  if (portName == (char *)0x0) {
    std::ios::clear((int)debugStream + (int)*(undefined8 *)(*(long *)debugStream + -0x18));
  }
  else {
    sVar1 = strlen(portName);
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,portName,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(debugStream," (RTL8211F): ",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)debugStream + -0x18) + (char)debugStream);
  std::ostream::put((char)debugStream);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(debugStream,"numReset: ",10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", numIRQ: ",10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void EthBasePort::PrintDebugDataRTL(std::ostream &debugStream, const quadlet_t *data, const char *portName)
{
    struct DebugData {
        uint32_t mdio_result;
        uint16_t numIRQ;
        uint16_t numReset;
    };
    const DebugData *p = reinterpret_cast<const DebugData *>(data);
    debugStream << "*** " << portName << " (RTL8211F): " << std::endl;
    debugStream << "numReset: " << p->numReset << ", numIRQ: " << p->numIRQ << std::endl;
}